

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtraPluginParametersForOutParameters_Test::TestBody
          (CommandLineInterfaceTest_ExtraPluginParametersForOutParameters_Test *this)

{
  string_view name;
  string_view expected_text;
  string_view contents;
  string local_38;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --plug_out=TestParameter:$tmpdir --xyz_opt=foo=bar --xyz_out=$tmpdir --abc_out=$tmpdir --abc_opt=foo=bar --unknown_plug_opt=Foo --proto_path=$tmpdir foo.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  expected_text._M_str = "Unknown flag: --unknown_plug_opt\n";
  expected_text._M_len = 0x21;
  CommandLineInterfaceTester::ExpectErrorText((CommandLineInterfaceTester *)this,expected_text);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ExtraPluginParametersForOutParameters) {
  // This doesn't rely on the plugin having been registered and instead that
  // the existence of --[name]_out is enough to make the --[name]_opt valid.
  // However, running out of process plugins found via the search path (i.e. -
  // not pre registered with --plugin) isn't support in this test suite, so we
  // list the options pre/post the _out directive, and then include _opt that
  // will be unknown, and confirm the failure output is about the expected
  // unknown directive, which means the other were accepted.
  // NOTE: UnrecognizedExtraParameters confirms that if two unknown _opt
  // directives appear, they both are reported.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  Run("protocol_compiler --plug_out=TestParameter:$tmpdir "
      "--xyz_opt=foo=bar --xyz_out=$tmpdir "
      "--abc_out=$tmpdir --abc_opt=foo=bar "
      "--unknown_plug_opt=Foo "
      "--proto_path=$tmpdir foo.proto");

  ExpectErrorText("Unknown flag: --unknown_plug_opt\n");
}